

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_20069f2::TRDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,TRDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> scripts,
          FlatSigningProvider *out)

{
  uint uVar1;
  long lVar2;
  CPubKey *pubkey;
  uint uVar3;
  CScript *pCVar4;
  bool bVar5;
  pointer piVar6;
  mapped_type *this_00;
  CScript *pCVar7;
  pointer piVar8;
  size_t pos;
  ulong uVar9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_158;
  undefined1 local_110;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_100;
  WitnessV1Taproot output;
  XOnlyPubKey xpk;
  TaprootBuilder builder;
  
  pCVar7 = scripts.m_data;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  builder.m_valid = true;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  builder.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  builder.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  piVar6 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)piVar8 - (long)piVar6 >> 2 != scripts.m_size) {
    __assert_fail("m_depths.size() == scripts.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                  ,0x496,
                  "virtual std::vector<CScript> (anonymous namespace)::TRDescriptor::MakeScripts(const std::vector<CPubKey> &, Span<const CScript>, FlatSigningProvider &) const"
                 );
  }
  for (uVar9 = 0; uVar9 < (ulong)((long)piVar8 - (long)piVar6 >> 2); uVar9 = uVar9 + 1) {
    uVar1 = (pCVar7->super_CScriptBase)._size;
    uVar3 = uVar1 - 0x1d;
    pCVar4 = (CScript *)(pCVar7->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar3 = uVar1;
      pCVar4 = pCVar7;
    }
    script.m_size._0_4_ = uVar3;
    script.m_data = (uchar *)pCVar4;
    script.m_size._4_4_ = 0;
    TaprootBuilder::Add(&builder,piVar6[uVar9],script,0xc0,true);
    piVar6 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->m_depths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar7 = pCVar7 + 1;
  }
  bVar5 = TaprootBuilder::IsComplete(&builder);
  if (bVar5) {
    pubkey = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pubkey != 0x41) {
      __assert_fail("keys.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                    ,0x49b,
                    "virtual std::vector<CScript> (anonymous namespace)::TRDescriptor::MakeScripts(const std::vector<CPubKey> &, Span<const CScript>, FlatSigningProvider &) const"
                   );
    }
    XOnlyPubKey::XOnlyPubKey(&xpk,pubkey);
    bVar5 = XOnlyPubKey::IsFullyValid(&xpk);
    if (bVar5) {
      TaprootBuilder::Finalize(&builder,&xpk);
      TaprootBuilder::GetOutput(&output,&builder);
      this_00 = std::
                map<XOnlyPubKey,_TaprootBuilder,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
                ::operator[](&out->tr_trees,&output.super_XOnlyPubKey);
      TaprootBuilder::operator=(this_00,&builder);
      CPubKey::GetID((CKeyID *)&local_158._M_first,
                     (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                     super__Vector_impl_data._M_start);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey_const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)&out->pubkeys,(CKeyID *)&local_158._M_first,
                 (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      local_158._M_first._M_storage._M_storage[0x10] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10];
      local_158._M_first._M_storage._M_storage[0x11] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11];
      local_158._M_first._M_storage._M_storage[0x12] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12];
      local_158._M_first._M_storage._M_storage[0x13] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13];
      local_158._M_first._M_storage._M_storage[0x14] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14];
      local_158._M_first._M_storage._M_storage[0x15] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15];
      local_158._M_first._M_storage._M_storage[0x16] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16];
      local_158._M_first._M_storage._M_storage[0x17] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17];
      local_158._M_first._M_storage._M_storage[0x18] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18];
      local_158._M_first._M_storage._M_storage[0x19] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19];
      local_158._M_first._M_storage._M_storage[0x1a] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_158._M_first._M_storage._M_storage[0x1b] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_158._M_first._M_storage._M_storage[0x1c] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_158._M_first._M_storage._M_storage[0x1d] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_158._M_first._M_storage._M_storage[0x1e] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_158._M_first._M_storage._M_storage[0x1f] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_158._M_first._M_storage._M_storage[0] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0];
      local_158._M_first._M_storage._M_storage[1] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[1];
      local_158._M_first._M_storage._M_storage[2] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[2];
      local_158._M_first._M_storage._M_storage[3] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[3];
      local_158._M_first._M_storage._M_storage[4] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[4];
      local_158._M_first._M_storage._M_storage[5] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[5];
      local_158._M_first._M_storage._M_storage[6] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[6];
      local_158._M_first._M_storage._M_storage[7] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[7];
      local_158._M_first._M_storage._M_storage[8] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[8];
      local_158._M_first._M_storage._M_storage[9] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[9];
      local_158._M_first._M_storage._M_storage[10] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[10];
      local_158._M_first._M_storage._M_storage[0xb] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb];
      local_158._M_first._M_storage._M_storage[0xc] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc];
      local_158._M_first._M_storage._M_storage[0xd] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd];
      local_158._M_first._M_storage._M_storage[0xe] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe];
      local_158._M_first._M_storage._M_storage[0xf] =
           output.super_XOnlyPubKey.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf];
      local_110 = 6;
      GetScriptForDestination((CScript *)&local_100,(CTxDestination *)&local_158._M_first);
      Vector<CScript>(__return_storage_ptr__,(CScript *)&local_100);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_100);
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)&local_158._M_first);
      goto LAB_005d1357;
    }
  }
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_005d1357:
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&builder.m_branch);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts, FlatSigningProvider& out) const override
    {
        TaprootBuilder builder;
        assert(m_depths.size() == scripts.size());
        for (size_t pos = 0; pos < m_depths.size(); ++pos) {
            builder.Add(m_depths[pos], scripts[pos], TAPROOT_LEAF_TAPSCRIPT);
        }
        if (!builder.IsComplete()) return {};
        assert(keys.size() == 1);
        XOnlyPubKey xpk(keys[0]);
        if (!xpk.IsFullyValid()) return {};
        builder.Finalize(xpk);
        WitnessV1Taproot output = builder.GetOutput();
        out.tr_trees[output] = builder;
        out.pubkeys.emplace(keys[0].GetID(), keys[0]);
        return Vector(GetScriptForDestination(output));
    }